

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcAnd.c
# Opt level: O1

void Gia_ManBmcAddCnf(Bmc_Mna_t *p,Gia_Man_t *pGia,Vec_Int_t *vIns,Vec_Int_t *vNodes,
                     Vec_Int_t *vOuts)

{
  int iVar1;
  Gia_Man_t *p_00;
  Aig_Man_t *pAig;
  Cnf_Dat_t *p_01;
  Vec_Int_t *pVVar2;
  int *piVar3;
  ulong uVar4;
  void *__s;
  int iVar5;
  Gia_Obj_t *pGVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  int *piVar10;
  int iVar11;
  long lVar12;
  
  p_00 = Gia_ManBmcDupCone(pGia,vIns,vNodes,vOuts);
  pAig = Gia_ManToAigSimple(p_00);
  p_01 = Cnf_Derive(pAig,pAig->nObjs[3]);
  iVar1 = p_01->nVars;
  iVar11 = vIns->nSize + vOuts->nSize;
  pVVar2 = (Vec_Int_t *)malloc(0x10);
  iVar5 = 0x10;
  if (0xe < (iVar1 - iVar11) - 1U) {
    iVar5 = iVar1 - iVar11;
  }
  pVVar2->nSize = 0;
  pVVar2->nCap = iVar5;
  if (iVar5 == 0) {
    piVar3 = (int *)0x0;
  }
  else {
    piVar3 = (int *)malloc((long)iVar5 << 2);
  }
  pVVar2->pArray = piVar3;
  if (0 < p_00->nObjs) {
    lVar7 = 0;
    lVar12 = 0;
    do {
      if (p_00->pObjs == (Gia_Obj_t *)0x0) break;
      uVar9 = *(uint *)(&p_00->pObjs->field_0x0 + lVar7);
      if (((~uVar9 & 0x1fffffff) != 0 && -1 < (int)uVar9) && (-1 < p_01->pVarNums[lVar12])) {
        uVar4 = ((ulong)(uint)-vIns->nSize + lVar12) - 1;
        iVar1 = (int)uVar4;
        if ((iVar1 < 0) || (vNodes->nSize <= iVar1)) goto LAB_004f2f0a;
        Vec_IntPush(pVVar2,vNodes->pArray[uVar4 & 0xffffffff]);
      }
      lVar12 = lVar12 + 1;
      lVar7 = lVar7 + 0xc;
    } while (lVar12 < p_00->nObjs);
  }
  iVar1 = Gia_ManBmcAssignVarIds(p,vIns,pVVar2,vOuts);
  if (pVVar2->pArray != (int *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (int *)0x0;
  }
  free(pVVar2);
  iVar5 = p_01->nVars;
  iVar11 = 0x10;
  if (0xe < iVar5 - 1U) {
    iVar11 = iVar5;
  }
  if (iVar11 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)iVar11 << 2);
  }
  memset(__s,0xff,(long)iVar5 * 4);
  piVar3 = p_01->pVarNums;
  iVar11 = *piVar3;
  if ((long)iVar11 < 1) {
    __assert_fail("pCnf->pVarNums[0] > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcBmcAnd.c"
                  ,0x206,
                  "void Gia_ManBmcAddCnf(Bmc_Mna_t *, Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                 );
  }
  if (iVar5 <= iVar11) {
LAB_004f2f67:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  *(int *)((long)__s + (long)iVar11 * 4) = iVar1;
  if (1 < p_00->nObjs) {
    pGVar6 = p_00->pObjs;
    lVar12 = 0;
    lVar7 = 0;
    do {
      pGVar6 = pGVar6 + 1;
      iVar1 = piVar3[lVar7 + 1];
      if (-1 < (long)iVar1) {
        if (p_01->nVars <= iVar1) {
          __assert_fail("pCnf->pVarNums[i] >= 0 && pCnf->pVarNums[i] < pCnf->nVars",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcBmcAnd.c"
                        ,0x20c,
                        "void Gia_ManBmcAddCnf(Bmc_Mna_t *, Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                       );
        }
        uVar9 = (uint)*(ulong *)pGVar6;
        if ((~uVar9 & 0x9fffffff) == 0) {
          if ((long)vIns->nSize < lVar7 + 1) goto LAB_004f2f0a;
          piVar10 = (int *)((long)vIns->pArray + lVar12);
        }
        else {
          uVar4 = *(ulong *)pGVar6 & 0x1fffffff;
          if (uVar4 == 0x1fffffff || (int)uVar9 < 0) {
            if ((-1 < (int)uVar9) || ((int)uVar4 == 0x1fffffff)) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcBmcAnd.c"
                            ,0x213,
                            "void Gia_ManBmcAddCnf(Bmc_Mna_t *, Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                           );
            }
            iVar11 = vNodes->nSize + vIns->nSize;
            pVVar2 = vOuts;
          }
          else {
            iVar11 = vIns->nSize;
            pVVar2 = vNodes;
          }
          uVar9 = (int)lVar7 - iVar11;
          if (((int)uVar9 < 0) || (pVVar2->nSize <= (int)uVar9)) {
LAB_004f2f0a:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          piVar10 = pVVar2->pArray + uVar9;
        }
        iVar11 = *piVar10;
        if (((long)iVar11 < 0) || (p->vId2Var->nSize <= iVar11)) goto LAB_004f2f0a;
        iVar11 = p->vId2Var->pArray[iVar11];
        if (iVar11 < 1) {
          __assert_fail("Vec_IntEntry(p->vId2Var, iObj) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcBmcAnd.c"
                        ,0x214,
                        "void Gia_ManBmcAddCnf(Bmc_Mna_t *, Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                       );
        }
        if (iVar5 <= iVar1) goto LAB_004f2f67;
        *(int *)((long)__s + (long)iVar1 * 4) = iVar11;
      }
      lVar8 = lVar7 + 2;
      lVar12 = lVar12 + 4;
      lVar7 = lVar7 + 1;
    } while (lVar8 < p_00->nObjs);
  }
  if (0 < p_01->nLiterals) {
    piVar3 = *p_01->pClauses;
    lVar7 = 0;
    do {
      uVar9 = piVar3[lVar7];
      if (((int)uVar9 < 2) || (p_01->nVars * 2 <= (int)uVar9)) {
        __assert_fail("pCnf->pClauses[0][i] > 1 && pCnf->pClauses[0][i] < 2 * pCnf->nVars",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcBmcAnd.c"
                      ,0x21b,
                      "void Gia_ManBmcAddCnf(Bmc_Mna_t *, Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      iVar1 = *(int *)((long)__s + (ulong)(uVar9 >> 1) * 4);
      if (iVar1 < 0) {
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                      ,0x10b,"int Abc_Var2Lit(int, int)");
      }
      piVar3[lVar7] = (uVar9 & 1) + iVar1 * 2;
      lVar7 = lVar7 + 1;
    } while (lVar7 < p_01->nLiterals);
  }
  if (__s != (void *)0x0) {
    free(__s);
  }
  lVar7 = 0;
  do {
    lVar12 = lVar7;
    if (p_01->nClauses <= lVar12) break;
    iVar1 = sat_solver_addclause(p->pSat,p_01->pClauses[lVar12],p_01->pClauses[lVar12 + 1]);
    lVar7 = lVar12 + 1;
  } while (iVar1 != 0);
  if ((int)lVar12 < p_01->nClauses) {
    puts("SAT solver became UNSAT after adding clauses.");
  }
  Aig_ManStop(pAig);
  Cnf_DataFree(p_01);
  Gia_ManStop(p_00);
  return;
}

Assistant:

void Gia_ManBmcAddCnf( Bmc_Mna_t * p, Gia_Man_t * pGia, Vec_Int_t * vIns, Vec_Int_t * vNodes, Vec_Int_t * vOuts )
{
    Gia_Man_t * pNew = Gia_ManBmcDupCone( pGia, vIns, vNodes, vOuts );
    Aig_Man_t * pAig = Gia_ManToAigSimple( pNew );
    Cnf_Dat_t * pCnf = Cnf_Derive( pAig, Aig_ManCoNum(pAig) );
    Vec_Int_t * vUsed, * vMap;
    Gia_Obj_t * pObj;
    int i, iObj, VarC0;
    // collect used variables
    vUsed = Vec_IntAlloc( pCnf->nVars - Vec_IntSize(vIns) - Vec_IntSize(vOuts) );
    Gia_ManForEachAnd( pNew, pObj, i )
        if ( pCnf->pVarNums[i] >= 0 )
            Vec_IntPush( vUsed, Vec_IntEntry(vNodes, i - Vec_IntSize(vIns) - 1) );
    // assign variable IDs
    VarC0 = Gia_ManBmcAssignVarIds( p, vIns, vUsed, vOuts );
    Vec_IntFree( vUsed );
    // create variable map from CNF vars into SAT vars
    vMap = Vec_IntStartFull( pCnf->nVars );
    assert( pCnf->pVarNums[0] > 0 );
    Vec_IntWriteEntry( vMap, pCnf->pVarNums[0], VarC0 );
    Gia_ManForEachObj1( pNew, pObj, i )
    {
        if ( pCnf->pVarNums[i] < 0 )
            continue;
        assert( pCnf->pVarNums[i] >= 0 && pCnf->pVarNums[i] < pCnf->nVars );
        if ( Gia_ObjIsCi(pObj) )
            iObj = Vec_IntEntry( vIns, i - 1 );
        else if ( Gia_ObjIsAnd(pObj) )
            iObj = Vec_IntEntry( vNodes, i - Vec_IntSize(vIns) - 1 );
        else if ( Gia_ObjIsCo(pObj) )
            iObj = Vec_IntEntry( vOuts, i - Vec_IntSize(vIns) - Vec_IntSize(vNodes) - 1 );
        else assert( 0 );
        assert( Vec_IntEntry(p->vId2Var, iObj) > 0 );
        Vec_IntWriteEntry( vMap, pCnf->pVarNums[i], Vec_IntEntry(p->vId2Var, iObj) );
    }
//Vec_IntPrint( vMap );
    // remap CNF
    for ( i = 0; i < pCnf->nLiterals; i++ )
    {
        assert( pCnf->pClauses[0][i] > 1 && pCnf->pClauses[0][i] < 2 * pCnf->nVars );
        pCnf->pClauses[0][i] = Abc_Lit2LitV( Vec_IntArray(vMap), pCnf->pClauses[0][i] );
    }
    Vec_IntFree( vMap );
    // add clauses
    for ( i = 0; i < pCnf->nClauses; i++ )
    {
/*
        int v;
        for ( v = 0; v < pCnf->pClauses[i+1] - pCnf->pClauses[i]; v++ )
            printf( "%d ", pCnf->pClauses[i][v] );
        printf( "\n" );
*/
        if ( !sat_solver_addclause( p->pSat, pCnf->pClauses[i], pCnf->pClauses[i+1] ) )
            break;
    }
    if ( i < pCnf->nClauses )
        printf( "SAT solver became UNSAT after adding clauses.\n" );
    Aig_ManStop( pAig );
    Cnf_DataFree( pCnf );
    Gia_ManStop( pNew );
}